

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O1

void __thiscall flatfile_tests::flatfile_filename::test_method(flatfile_filename *this)

{
  long lVar1;
  path dir;
  path dir_00;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  readonly_property<bool> rVar5;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffd08;
  readonly_property<bool> in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd11;
  bool in_stack_fffffffffffffd18;
  bool bVar6;
  undefined7 in_stack_fffffffffffffd19;
  undefined7 uVar7;
  shared_count in_stack_fffffffffffffd20;
  shared_count sVar8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffd28;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  FlatFilePos pos;
  path *local_288;
  lazy_ostream local_280;
  undefined1 *local_270;
  path **local_268;
  path *local_260;
  undefined **local_258;
  undefined1 local_250;
  undefined1 *local_248;
  path **local_240;
  FlatFileSeq *local_238;
  char *local_230;
  assertion_result local_228;
  path local_210;
  path local_1e8;
  undefined1 local_1c0 [40];
  path local_198;
  path local_170;
  FlatFileSeq seq2;
  path local_110;
  path local_e8;
  path local_c0;
  FlatFileSeq seq1;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  pos.nFile = 0x1c8;
  pos.nPos = 0x315;
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length._0_1_ =
       (readonly_property<bool>)
       (readonly_property<bool>)in_stack_fffffffffffffd10.super_class_property<bool>.value;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd08;
  dir.super_path._M_pathname._M_string_length._1_7_ = in_stack_fffffffffffffd11;
  dir.super_path._M_pathname.field_2._M_local_buf[0] = in_stack_fffffffffffffd18;
  dir.super_path._M_pathname.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffd19;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffd20.pi_;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffd28._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq1,dir,(char *)&local_c0,0xe981ba);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x16;
  file.m_begin = (iterator)&local_2a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b0,msg);
  local_280.m_empty = false;
  local_280._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_270 = boost::unit_test::lazy_ostream::inst;
  local_268 = (path **)0xf6cf21;
  FlatFileSeq::FileName(&seq2.m_dir,&seq1,&pos);
  std::filesystem::__cxx11::path::path(&local_110,&data_dir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_110,10,"a00456.dat");
  std::filesystem::__cxx11::path::path(&local_e8,&local_110);
  iVar2 = std::filesystem::__cxx11::path::compare((path *)&seq2);
  rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
  bVar6 = false;
  uVar7 = 0;
  sVar8.pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_228.m_message.px = (element_type *)0xe9599a;
  local_1c0._24_8_ = &local_238;
  local_1c0[8] = 0;
  local_1c0._0_8_ = &PTR__lazy_ostream_013ac130;
  local_1c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_240 = &local_260;
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_013ac130;
  local_248 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_260 = &local_e8;
  local_238 = &seq2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xfffffffffffffd10,&local_280,1,2,REQUIRE,0xe959ad,
             (size_t)&local_228,0x16,(path *)local_1c0,"data_dir / \"a00456.dat\"",&local_258);
  boost::detail::shared_count::~shared_count((shared_count *)&stack0xfffffffffffffd20);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::filesystem::__cxx11::path::~path((path *)&seq2);
  std::filesystem::__cxx11::path::path(&local_198,&data_dir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_198,1,"a");
  std::filesystem::__cxx11::path::path(&local_170,&local_198);
  dir_00.super_path._M_pathname._M_string_length._0_1_ = rVar5.super_class_property<bool>.value;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd08;
  dir_00.super_path._M_pathname._M_string_length._1_7_ = in_stack_fffffffffffffd11;
  dir_00.super_path._M_pathname.field_2._M_local_buf[0] = bVar6;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity._1_7_ = uVar7;
  dir_00.super_path._M_pathname.field_2._8_8_ = sVar8.pi_;
  dir_00.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffd28._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq2,dir_00,(char *)&local_170,0xe55f2d);
  std::filesystem::__cxx11::path::~path(&local_170);
  std::filesystem::__cxx11::path::~path(&local_198);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x19;
  file_00.m_begin = (iterator)&local_2c0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,
             msg_00);
  FlatFileSeq::FileName((path *)&local_e8,&seq2,&pos);
  std::filesystem::__cxx11::path::path(&local_210,&data_dir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_210,1,"a");
  std::filesystem::__cxx11::path::path(&local_1e8,&local_210);
  std::filesystem::__cxx11::path::_M_append(&local_1e8,10,"b00456.dat");
  std::filesystem::__cxx11::path::path((path *)local_1c0,&local_1e8);
  iVar2 = std::filesystem::__cxx11::path::compare(&local_e8);
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_238 = (FlatFileSeq *)0xe95933;
  local_230 = "";
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_013ac130;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_240 = &local_260;
  local_268 = &local_288;
  local_280.m_empty = false;
  local_280._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac130;
  local_270 = boost::unit_test::lazy_ostream::inst;
  local_288 = (path *)local_1c0;
  local_260 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&stack0xfffffffffffffd10,1,2,REQUIRE,0xe959e3,
             (size_t)&local_238,0x19,&local_258,"data_dir / \"a\" / \"b00456.dat\"",&local_280);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_1c0);
  std::filesystem::__cxx11::path::~path(&local_1e8);
  std::filesystem::__cxx11::path::~path(&local_210);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path((path *)&seq2);
  std::filesystem::__cxx11::path::~path((path *)&seq1);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_filename)
{
    const auto data_dir = m_args.GetDataDirBase();

    FlatFilePos pos(456, 789);

    FlatFileSeq seq1(data_dir, "a", 16 * 1024);
    BOOST_CHECK_EQUAL(seq1.FileName(pos), data_dir / "a00456.dat");

    FlatFileSeq seq2(data_dir / "a", "b", 16 * 1024);
    BOOST_CHECK_EQUAL(seq2.FileName(pos), data_dir / "a" / "b00456.dat");

    // Check default constructor IsNull
    assert(FlatFilePos{}.IsNull());
}